

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isMipmapLinearSampleResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               FilterMode levelFilter,LookupPrecision *prec,float coordX,int coordY,Vec2 *fBounds,
               Vec4 *result)

{
  ulong uVar1;
  int dim;
  int dim_00;
  byte bVar2;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  short sVar18;
  long lVar19;
  undefined8 uVar20;
  bool bVar21;
  TextureChannelClass TVar22;
  int iVar23;
  int iVar24;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 uVar25;
  uint uVar26;
  ulong uVar27;
  int i0;
  int iVar28;
  Vec2 *pVVar29;
  undefined4 in_register_0000008c;
  Vec4 *pVVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar52 [16];
  ushort uVar53;
  int iVar54;
  int iVar55;
  undefined1 auVar57 [16];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  int w0;
  Vector<bool,_4> res;
  Vec4 c0_1;
  Vec2 uBounds0;
  ColorLine line0;
  Vec2 uBounds1;
  Vec4 c1;
  float local_1c4;
  undefined1 local_178 [32];
  undefined1 local_158 [40];
  BVec4 local_130;
  float fStack_12c;
  ConstPixelBufferAccess local_128;
  float local_100;
  float fStack_fc;
  float local_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  undefined1 local_e8 [16];
  float local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  Vec4 local_c8;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  TextureFormat local_48;
  float fStack_40;
  float fStack_3c;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  undefined1 auVar44 [16];
  undefined1 auVar56 [16];
  
  pVVar30 = (Vec4 *)CONCAT44(in_register_0000008c,coordY);
  dim = (level0->m_size).m_data[0];
  dim_00 = (level1->m_size).m_data[0];
  local_158._32_8_ = level1;
  if (levelFilter == LINEAR) {
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&local_130,sampler->normalizedCoords,dim,coordX,
               (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&local_100,sampler->normalizedCoords,dim_00,coordX,
               (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    fVar39 = floorf((float)local_130.m_data + -0.5);
    fVar40 = floorf(fStack_12c + -0.5);
    fVar41 = floorf(local_100 + -0.5);
    fVar42 = floorf(fStack_fc + -0.5);
    TVar22 = getTextureChannelClass((level0->m_format).type);
    if (TVar22 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_1c4 = computeBilinearSearchStepForSnorm(prec);
    }
    else {
      local_1c4 = 0.0;
      if (TVar22 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
        local_1c4 = computeBilinearSearchStepForUnorm(prec);
      }
    }
    if ((int)fVar39 <= (int)fVar40) {
      fVar39 = (float)(int)fVar39;
      local_178._20_4_ = (int)fVar40;
      do {
        local_128.m_size.m_data[2] = 0;
        local_128.m_pitch.m_data[0] = 0;
        local_128.m_pitch.m_data[1] = 0;
        local_128.m_pitch.m_data[2] = 0;
        local_128.m_format.order = R;
        local_128.m_format.type = SNORM_INT8;
        local_128.m_size.m_data[0] = 0;
        local_128.m_size.m_data[1] = 0;
        iVar23 = TexVerifierUtil::wrap(sampler->wrapS,(int)fVar39,dim);
        local_178._24_4_ = (int)fVar39 + 1;
        iVar24 = TexVerifierUtil::wrap(sampler->wrapS,local_178._24_4_,dim);
        lookupLine((ColorLine *)&local_128,level0,sampler,iVar23,iVar24,coordY);
        local_e8 = ZEXT416((uint)local_1c4);
        uVar25 = extraout_EAX;
        if (TVar22 == TEXTURECHANNELCLASS_FLOATING_POINT) {
          local_e8._0_4_ = computeBilinearSearchStepFromFloatLine(prec,(ColorLine *)&local_128);
          local_e8._4_4_ = extraout_XMM0_Db;
          local_e8._8_4_ = extraout_XMM0_Dc;
          local_e8._12_4_ = extraout_XMM0_Dd;
          uVar25 = extraout_EAX_00;
        }
        fVar43 = (float)(int)fVar39;
        fVar46 = ((float)local_130.m_data + -0.5) - fVar43;
        fVar49 = (fStack_12c + -0.5) - fVar43;
        iVar23 = -(uint)(1.0 < fVar46);
        iVar24 = -(uint)(1.0 < fVar49);
        auVar45._4_4_ = iVar24;
        auVar45._0_4_ = iVar23;
        auVar45._8_4_ = iVar24;
        auVar45._12_4_ = iVar24;
        auVar44._8_8_ = auVar45._8_8_;
        auVar44._4_4_ = iVar23;
        auVar44._0_4_ = iVar23;
        uVar26 = movmskpd(uVar25,auVar44);
        fVar39 = 1.0;
        fVar40 = 0.0;
        fVar48 = 0.0;
        fVar50 = 0.0;
        if ((uVar26 & 1) == 0) {
          fVar39 = fVar46;
          fVar40 = fVar49;
          fVar48 = 0.0 - fVar43;
          fVar50 = 0.0 - fVar43;
        }
        fVar47 = 1.0;
        fVar51 = 0.0;
        if ((uVar26 & 2) == 0) {
          fVar47 = fVar49;
          fVar51 = fVar49;
        }
        if ((int)fVar41 <= (int)fVar42) {
          local_f8 = (float)(~-(uint)(fVar46 < 0.0) & (uint)fVar39);
          uStack_f4 = ~(uint)fVar49 & (uint)fVar40;
          uStack_f0 = ~(uint)(0.0 - fVar43) & (uint)fVar48;
          uStack_ec = ~(uint)(0.0 - fVar43) & (uint)fVar50;
          local_d8 = (float)(~-(uint)(fVar49 < 0.0) & (uint)fVar47);
          uStack_d4 = ~(uint)fVar49 & (uint)fVar51;
          uStack_d0 = ~(uint)fVar49 & (uint)fVar51;
          uStack_cc = ~(uint)fVar49 & (uint)fVar51;
          local_88 = (float)(~-(uint)((float)local_128.m_format.order <=
                                     (float)local_128.m_size.m_data[2]) & local_128.m_size.m_data[2]
                            | local_128.m_format.order &
                              -(uint)((float)local_128.m_format.order <=
                                     (float)local_128.m_size.m_data[2]));
          fStack_84 = (float)(~-(uint)((float)local_128.m_format.type <=
                                      (float)local_128.m_pitch.m_data[0]) &
                              local_128.m_pitch.m_data[0] |
                             local_128.m_format.type &
                             -(uint)((float)local_128.m_format.type <=
                                    (float)local_128.m_pitch.m_data[0]));
          fStack_80 = (float)(~-(uint)((float)local_128.m_size.m_data[0] <=
                                      (float)local_128.m_pitch.m_data[1]) &
                              local_128.m_pitch.m_data[1] |
                             local_128.m_size.m_data[0] &
                             -(uint)((float)local_128.m_size.m_data[0] <=
                                    (float)local_128.m_pitch.m_data[1]));
          fStack_7c = (float)(~-(uint)((float)local_128.m_size.m_data[1] <=
                                      (float)local_128.m_pitch.m_data[2]) &
                              local_128.m_pitch.m_data[2] |
                             local_128.m_size.m_data[1] &
                             -(uint)((float)local_128.m_size.m_data[1] <=
                                    (float)local_128.m_pitch.m_data[2]));
          local_a8 = (float)local_128.m_format.order;
          fStack_a4 = (float)local_128.m_format.type;
          fStack_a0 = (float)local_128.m_size.m_data[0];
          fStack_9c = (float)local_128.m_size.m_data[1];
          local_b8 = (float)local_128.m_size.m_data[2];
          fStack_b4 = (float)local_128.m_pitch.m_data[0];
          fStack_b0 = (float)local_128.m_pitch.m_data[1];
          fStack_ac = (float)local_128.m_pitch.m_data[2];
          local_98 = (float)(~-(uint)((float)local_128.m_size.m_data[2] <=
                                     (float)local_128.m_format.order) & local_128.m_size.m_data[2] |
                            local_128.m_format.order &
                            -(uint)((float)local_128.m_size.m_data[2] <=
                                   (float)local_128.m_format.order));
          fStack_94 = (float)(~-(uint)((float)local_128.m_pitch.m_data[0] <=
                                      (float)local_128.m_format.type) & local_128.m_pitch.m_data[0]
                             | local_128.m_format.type &
                               -(uint)((float)local_128.m_pitch.m_data[0] <=
                                      (float)local_128.m_format.type));
          fStack_90 = (float)(~-(uint)((float)local_128.m_pitch.m_data[1] <=
                                      (float)local_128.m_size.m_data[0]) &
                              local_128.m_pitch.m_data[1] |
                             local_128.m_size.m_data[0] &
                             -(uint)((float)local_128.m_pitch.m_data[1] <=
                                    (float)local_128.m_size.m_data[0]));
          fStack_8c = (float)(~-(uint)((float)local_128.m_pitch.m_data[2] <=
                                      (float)local_128.m_size.m_data[1]) &
                              local_128.m_pitch.m_data[2] |
                             local_128.m_size.m_data[1] &
                             -(uint)((float)local_128.m_pitch.m_data[2] <=
                                    (float)local_128.m_size.m_data[1]));
          iVar23 = (int)fVar41;
          do {
            local_158._16_4_ = 0.0;
            local_158._20_4_ = 0.0;
            local_158._24_4_ = 0.0;
            local_158._28_4_ = 0.0;
            local_158._0_4_ = R;
            local_158._4_4_ = SNORM_INT8;
            local_158._8_4_ = 0;
            local_158._12_4_ = 0;
            iVar24 = TexVerifierUtil::wrap(sampler->wrapS,iVar23,dim_00);
            iVar28 = iVar23 + 1;
            uVar26 = TexVerifierUtil::wrap(sampler->wrapS,iVar28,dim_00);
            pVVar29 = (Vec2 *)(ulong)uVar26;
            pVVar30 = (Vec4 *)(ulong)(uint)coordY;
            lookupLine((ColorLine *)local_158,(ConstPixelBufferAccess *)local_158._32_8_,sampler,
                       iVar24,uVar26,coordY);
            fVar39 = local_1c4;
            if (TVar22 == TEXTURECHANNELCLASS_FLOATING_POINT) {
              fVar39 = computeBilinearSearchStepFromFloatLine(prec,(ColorLine *)local_158);
            }
            fVar48 = (local_100 + -0.5) - (float)iVar23;
            fVar50 = (fStack_fc + -0.5) - (float)iVar23;
            iVar23 = -(uint)(fVar48 < 0.0);
            iVar24 = -(uint)(fVar50 < 0.0);
            auVar57._4_4_ = iVar24;
            auVar57._0_4_ = iVar23;
            auVar57._8_4_ = iVar24;
            auVar57._12_4_ = iVar24;
            auVar56._8_8_ = auVar57._8_8_;
            auVar56._4_4_ = iVar23;
            auVar56._0_4_ = iVar23;
            uVar26 = movmskpd((int)fBounds,auVar56);
            fVar40 = 0.0;
            if (((uVar26 & 2) == 0) && (fVar40 = 1.0, fVar50 <= 1.0)) {
              fVar40 = fVar50;
            }
            fVar47 = (float)(~-(uint)((float)local_158._0_4_ <= (float)local_158._16_4_) &
                             local_158._16_4_ |
                            local_158._0_4_ &
                            -(uint)((float)local_158._0_4_ <= (float)local_158._16_4_));
            fVar51 = (float)(~-(uint)((float)local_158._4_4_ <= (float)local_158._20_4_) &
                             local_158._20_4_ |
                            local_158._4_4_ &
                            -(uint)((float)local_158._4_4_ <= (float)local_158._20_4_));
            fVar58 = (float)(~-(uint)((float)local_158._8_4_ <= (float)local_158._24_4_) &
                             local_158._24_4_ |
                            local_158._8_4_ &
                            -(uint)((float)local_158._8_4_ <= (float)local_158._24_4_));
            fVar59 = (float)(~-(uint)((float)local_158._12_4_ <= (float)local_158._28_4_) &
                             local_158._28_4_ |
                            local_158._12_4_ &
                            -(uint)((float)local_158._12_4_ <= (float)local_158._28_4_));
            uVar31 = -(uint)(local_88 <= fVar47);
            uVar33 = -(uint)(fStack_84 <= fVar51);
            uVar35 = -(uint)(fStack_80 <= fVar58);
            uVar37 = -(uint)(fStack_7c <= fVar59);
            fVar50 = (prec->colorThreshold).m_data[0];
            fVar43 = (prec->colorThreshold).m_data[1];
            fVar46 = (prec->colorThreshold).m_data[2];
            fVar49 = (prec->colorThreshold).m_data[3];
            fVar60 = (float)(~-(uint)((float)local_158._16_4_ <= (float)local_158._0_4_) &
                             local_158._16_4_ |
                            local_158._0_4_ &
                            -(uint)((float)local_158._16_4_ <= (float)local_158._0_4_));
            fVar61 = (float)(~-(uint)((float)local_158._20_4_ <= (float)local_158._4_4_) &
                             local_158._20_4_ |
                            local_158._4_4_ &
                            -(uint)((float)local_158._20_4_ <= (float)local_158._4_4_));
            fVar62 = (float)(~-(uint)((float)local_158._24_4_ <= (float)local_158._8_4_) &
                             local_158._24_4_ |
                            local_158._8_4_ &
                            -(uint)((float)local_158._24_4_ <= (float)local_158._8_4_));
            fVar63 = (float)(~-(uint)((float)local_158._28_4_ <= (float)local_158._12_4_) &
                             local_158._28_4_ |
                            local_158._12_4_ &
                            -(uint)((float)local_158._28_4_ <= (float)local_158._12_4_));
            uVar32 = -(uint)(fVar60 <= local_98);
            uVar34 = -(uint)(fVar61 <= fStack_94);
            uVar36 = -(uint)(fVar62 <= fStack_90);
            uVar38 = -(uint)(fVar63 <= fStack_8c);
            iVar23 = -(uint)(result->m_data[0] <=
                             (float)(~uVar32 & (uint)fVar60 | (uint)local_98 & uVar32) + fVar50 &&
                            (float)(~uVar31 & (uint)fVar47 | (uint)local_88 & uVar31) - fVar50 <=
                            result->m_data[0]);
            iVar24 = -(uint)(result->m_data[1] <=
                             (float)(~uVar34 & (uint)fVar61 | (uint)fStack_94 & uVar34) + fVar43 &&
                            (float)(~uVar33 & (uint)fVar51 | (uint)fStack_84 & uVar33) - fVar43 <=
                            result->m_data[1]);
            iVar54 = -(uint)(result->m_data[2] <=
                             (float)(~uVar36 & (uint)fVar62 | (uint)fStack_90 & uVar36) + fVar46 &&
                            (float)(~uVar35 & (uint)fVar58 | (uint)fStack_80 & uVar35) - fVar46 <=
                            result->m_data[2]);
            iVar55 = -(uint)(result->m_data[3] <=
                             (float)(~uVar38 & (uint)fVar63 | (uint)fStack_8c & uVar38) + fVar49 &&
                            (float)(~uVar37 & (uint)fVar59 | (uint)fStack_7c & uVar37) - fVar49 <=
                            result->m_data[3]);
            uVar10 = -(short)(iVar23 >> 0x1f);
            cVar14 = -(char)(iVar23 >> 0x1f);
            bVar2 = (uVar10 != 0) * (uVar10 < 0x100) * cVar14 - (0xff < uVar10);
            uVar53 = (ushort)bVar2;
            uVar11 = -(short)(iVar24 >> 0x1f);
            cVar15 = -(char)(iVar24 >> 0x1f);
            bVar3 = (uVar11 != 0) * (uVar11 < 0x100) * cVar15 - (0xff < uVar11);
            uVar12 = -(short)(iVar54 >> 0x1f);
            cVar16 = (char)(iVar54 >> 0x1f);
            bVar4 = (uVar12 != 0) * (uVar12 < 0x100) * -cVar16 - (0xff < uVar12);
            sVar18 = (short)(iVar55 >> 0x1f);
            uVar13 = -sVar18;
            cVar17 = (char)(iVar55 >> 0x1f);
            bVar5 = (uVar13 != 0) * (uVar13 < 0x100) * -cVar17 - (0xff < uVar13);
            bVar6 = (uVar10 != 0) * (uVar10 < 0x100) * cVar14 - (0xff < uVar10);
            bVar7 = (uVar11 != 0) * (uVar11 < 0x100) * cVar15 - (0xff < uVar11);
            bVar8 = (uVar12 != 0) * (uVar12 < 0x100) * -cVar16 - (0xff < uVar12);
            uVar10 = -sVar18;
            bVar9 = (uVar10 != 0) * (uVar10 < 0x100) * -cVar17 - (0xff < uVar10);
            uVar10 = (ushort)bVar3;
            auVar52[1] = (bVar3 != 0) * (uVar10 < 0x100) * bVar3 - (0xff < uVar10);
            auVar52[0] = (bVar2 != 0) * (uVar53 < 0x100) * bVar2 - (0xff < uVar53);
            uVar11 = (ushort)bVar4;
            auVar52[2] = (bVar4 != 0) * (uVar11 < 0x100) * bVar4 - (0xff < uVar11);
            uVar12 = (ushort)bVar5;
            auVar52[3] = (bVar5 != 0) * (uVar12 < 0x100) * bVar5 - (0xff < uVar12);
            auVar52._4_4_ = 0;
            auVar52[8] = (bVar2 != 0) * (uVar53 < 0x100) * bVar2 - (0xff < uVar53);
            auVar52[9] = (bVar3 != 0) * (uVar10 < 0x100) * bVar3 - (0xff < uVar10);
            auVar52[10] = (bVar4 != 0) * (uVar11 < 0x100) * bVar4 - (0xff < uVar11);
            auVar52[0xb] = (bVar5 != 0) * (uVar12 < 0x100) * bVar5 - (0xff < uVar12);
            auVar52[0xc] = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
            auVar52[0xd] = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
            auVar52[0xe] = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
            auVar52[0xf] = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
            auVar52 = ZEXT416(*(uint *)(prec->colorMask).m_data) ^ _DAT_01b89df0 | auVar52;
            local_178._0_4_ = auVar52._0_4_;
            fVar50 = 0.0;
            if (((uVar26 & 1) == 0) && (fVar50 = 1.0, fVar48 <= 1.0)) {
              fVar50 = fVar48;
            }
            if (auVar52[0] != '\0') {
              uVar26 = -(uint)(local_e8._0_4_ <= fVar39);
              fVar39 = (float)(~uVar26 & (uint)fVar39 | uVar26 & (uint)local_e8._0_4_);
              uVar27 = 0xffffffffffffffff;
              do {
                if (uVar27 == 2) goto LAB_019bebc3;
                uVar1 = uVar27 + 1;
                lVar19 = uVar27 + 2;
                uVar27 = uVar1;
              } while (local_178[lVar19] != '\0');
              if (2 < uVar1) {
LAB_019bebc3:
                local_178._28_4_ = local_d8 + fVar39;
                if (local_f8 < (float)local_178._28_4_) {
                  local_48.order = local_158._0_4_;
                  local_48.type = local_158._4_4_;
                  fStack_40 = (float)local_158._8_4_;
                  fStack_3c = (float)local_158._12_4_;
                  local_58 = (float)local_158._16_4_;
                  fStack_54 = (float)local_158._20_4_;
                  fStack_50 = (float)local_158._24_4_;
                  fStack_4c = (float)local_158._28_4_;
                  local_68 = ZEXT416((uint)fVar40);
                  fVar48 = local_f8;
                  uStack_74 = uStack_f4;
                  uStack_70 = uStack_f0;
                  uStack_6c = uStack_ec;
                  do {
                    fVar43 = (float)(~-(uint)(fVar48 <= local_d8) & (uint)local_d8 |
                                    -(uint)(fVar48 <= local_d8) & (uint)fVar48);
                    fVar46 = 1.0 - fVar43;
                    local_178._4_4_ = fVar43 * fStack_b4 + fVar46 * fStack_a4;
                    local_178._0_4_ = fVar43 * local_b8 + fVar46 * local_a8;
                    local_178._12_4_ = fVar43 * fStack_ac + fVar46 * fStack_9c;
                    local_178._8_4_ = fVar43 * fStack_b0 + fVar46 * fStack_a0;
                    local_78 = fVar48;
                    fVar48 = fVar50;
                    if (fVar50 <= fVar40) {
                      do {
                        fVar40 = (float)(~-(uint)(fVar48 <= fVar40) & (uint)fVar40 |
                                        -(uint)(fVar48 <= fVar40) & (uint)fVar48);
                        fVar43 = 1.0 - fVar40;
                        local_c8.m_data[0] = fVar40 * local_58 + fVar43 * (float)local_48.order;
                        local_c8.m_data[1] = fVar40 * fStack_54 + fVar43 * (float)local_48.type;
                        local_c8.m_data[2] = fVar40 * fStack_50 + fVar43 * fStack_40;
                        local_c8.m_data[3] = fVar40 * fStack_4c + fVar43 * fStack_3c;
                        bVar21 = isLinearRangeValid((tcu *)prec,(LookupPrecision *)local_178,
                                                    &local_c8,result,pVVar29,pVVar30);
                        if (bVar21) {
                          return true;
                        }
                        fVar48 = fVar48 + fVar39;
                        fVar40 = (float)local_68._0_4_;
                      } while (fVar48 <= (float)local_68._0_4_);
                    }
                    fVar48 = local_78 + fVar39;
                  } while (fVar48 < (float)local_178._28_4_);
                }
              }
            }
            iVar23 = iVar28;
          } while (iVar28 <= (int)fVar42);
        }
        fVar39 = (float)local_178._24_4_;
      } while ((int)local_178._24_4_ <= (int)local_178._20_4_);
    }
  }
  else {
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&local_c8,sampler->normalizedCoords,dim,coordX,
               (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    uVar26 = (prec->uvwBits).m_data[0];
    pVVar29 = (Vec2 *)(ulong)uVar26;
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&local_130,sampler->normalizedCoords,dim_00,coordX,
               (prec->coordBits).m_data[0],uVar26);
    fVar39 = floorf(local_c8.m_data[0]);
    iVar23 = (int)fVar39;
    fVar39 = floorf(local_c8.m_data[1]);
    fVar40 = floorf((float)local_130.m_data);
    fVar41 = floorf(fStack_12c);
    if (iVar23 <= (int)fVar39) {
      iVar24 = (int)fVar40;
      do {
        for (; iVar24 <= (int)fVar41; iVar24 = iVar24 + 1) {
          iVar28 = TexVerifierUtil::wrap(sampler->wrapS,iVar23,dim);
          if ((((iVar28 < 0) || ((level0->m_size).m_data[0] <= iVar28)) || (coordY < 0)) ||
             (((level0->m_size).m_data[1] <= coordY || ((level0->m_size).m_data[2] < 1)))) {
            sampleTextureBorder<float>((TextureFormat *)local_158,(Sampler *)level0);
          }
          else {
            pVVar29 = (Vec2 *)0x0;
            ConstPixelBufferAccess::getPixel(&local_128,(int)level0,iVar28,coordY);
            bVar21 = isSRGB(level0->m_format);
            if (bVar21) {
              sRGBToLinear((tcu *)local_158,(Vec4 *)&local_128);
            }
          }
          iVar28 = TexVerifierUtil::wrap(sampler->wrapS,iVar24,dim_00);
          uVar20 = local_158._32_8_;
          if (((iVar28 < 0) || ((int)*(WrapMode *)(local_158._32_8_ + 8) <= iVar28)) ||
             ((coordY < 0 ||
              (((int)*(FilterMode *)(local_158._32_8_ + 0xc) <= coordY ||
               ((int)*(FilterMode *)(local_158._32_8_ + 0x10) < 1)))))) {
            sampleTextureBorder<float>((TextureFormat *)local_178,(Sampler *)local_158._32_8_);
          }
          else {
            pVVar29 = (Vec2 *)0x0;
            ConstPixelBufferAccess::getPixel(&local_128,(int)local_158._32_8_,iVar28,coordY);
            bVar21 = isSRGB(*(TextureFormat *)uVar20);
            if (bVar21) {
              sRGBToLinear((tcu *)local_178,(Vec4 *)&local_128);
            }
          }
          bVar21 = isLinearRangeValid((tcu *)prec,(LookupPrecision *)local_158,(Vec4 *)local_178,
                                      result,pVVar29,pVVar30);
          if (bVar21) {
            return true;
          }
        }
        iVar23 = iVar23 + 1;
        iVar24 = (int)fVar40;
      } while (iVar23 <= (int)fVar39);
    }
  }
  return false;
}

Assistant:

static bool isMipmapLinearSampleResultValid (const ConstPixelBufferAccess&		level0,
										     const ConstPixelBufferAccess&		level1,
											 const Sampler&						sampler,
										     const Sampler::FilterMode			levelFilter,
										     const LookupPrecision&				prec,
										     const float						coordX,
											 const int							coordY,
										     const Vec2&						fBounds,
										     const Vec4&						result)
{
	if (levelFilter == Sampler::LINEAR)
		return isLinearMipmapLinearSampleResultValid(level0, level1, sampler, prec, coordX, coordY, fBounds, result);
	else
		return isNearestMipmapLinearSampleResultValid(level0, level1, sampler, prec, coordX, coordY, fBounds, result);
}